

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

bool __thiscall
glslang::TSymbolTableLevel::insert
          (TSymbolTableLevel *this,TSymbol *symbol,bool separateNameSpaces,TString *forcedKeyName)

{
  pointer pcVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TPoolAllocator *pTVar7;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar8;
  size_t sVar9;
  byte extraout_DL;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__args;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__args_00;
  char buf [20];
  TPoolAllocator *local_58;
  undefined1 *local_50;
  undefined1 local_40 [16];
  TSymbol *local_30;
  
  iVar3 = (*symbol->_vptr_TSymbol[3])(symbol);
  local_30 = symbol;
  if (forcedKeyName->_M_string_length == 0) {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var,iVar3),"");
    if (iVar4 == 0) {
      iVar3 = (*symbol->_vptr_TSymbol[9])(symbol);
      this->anonId = this->anonId + 1;
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xe0))
                ((long *)CONCAT44(extraout_var_02,iVar3));
      iVar3 = (*symbol->_vptr_TSymbol[9])(symbol);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0xe8))
                        ((long *)CONCAT44(extraout_var_03,iVar3));
      snprintf((char *)&local_58,0x14,"%s%d","anon@",(ulong)uVar5);
      pTVar7 = GetThreadPoolAllocator();
      pbVar8 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               TPoolAllocator::allocate(pTVar7,0x28);
      pTVar7 = GetThreadPoolAllocator();
      *(TPoolAllocator **)pbVar8 = pTVar7;
      *(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> **)(pbVar8 + 8) =
           pbVar8 + 0x18;
      sVar9 = strlen((char *)&local_58);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar8,&local_58,(long)&local_58 + sVar9);
      (*symbol->_vptr_TSymbol[4])(symbol,pbVar8);
      bVar2 = insertAnonymousMembers(this,symbol,0);
      goto LAB_003e12dc;
    }
    iVar4 = (*symbol->_vptr_TSymbol[6])();
    forcedKeyName = (TString *)CONCAT44(extraout_var_00,iVar4);
    iVar4 = (*symbol->_vptr_TSymbol[7])(symbol);
    if (CONCAT44(extraout_var_01,iVar4) != 0) {
      if (!separateNameSpaces) {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
                        *)this,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                *)CONCAT44(extraout_var,iVar3));
        if ((_Rb_tree_header *)iVar6._M_node != &(this->level)._M_t._M_impl.super__Rb_tree_header) {
          bVar2 = 0;
          goto LAB_003e12dc;
        }
      }
      local_58 = GetThreadPoolAllocator();
      pcVar1 = (forcedKeyName->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_58,pcVar1,pcVar1 + forcedKeyName->_M_string_length);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
                ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_bool>
                  *)this,(_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
                          *)&local_58,__args_00);
      bVar2 = 1;
      goto LAB_003e12dc;
    }
  }
  local_58 = GetThreadPoolAllocator();
  pcVar1 = (forcedKeyName->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      &local_58,pcVar1,pcVar1 + forcedKeyName->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
            ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_bool>
              *)this,(_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
                      *)&local_58,__args);
  bVar2 = extraout_DL;
LAB_003e12dc:
  return (bool)(bVar2 & 1);
}

Assistant:

bool insert(TSymbol& symbol, bool separateNameSpaces, const TString& forcedKeyName = TString())
    {
        //
        // returning true means symbol was added to the table with no semantic errors
        //
        const TString& name = symbol.getName();
        if (forcedKeyName.length()) {
            return level.insert(tLevelPair(forcedKeyName, &symbol)).second;
        }
        else if (name == "") {
            symbol.getAsVariable()->setAnonId(anonId++);
            // An empty name means an anonymous container, exposing its members to the external scope.
            // Give it a name and insert its members in the symbol table, pointing to the container.
            char buf[20];
            snprintf(buf, 20, "%s%d", AnonymousPrefix, symbol.getAsVariable()->getAnonId());
            symbol.changeName(NewPoolTString(buf));

            return insertAnonymousMembers(symbol, 0);
        } else {
            // Check for redefinition errors:
            // - STL itself will tell us if there is a direct name collision, with name mangling, at this level
            // - additionally, check for function-redefining-variable name collisions
            const TString& insertName = symbol.getMangledName();
            if (symbol.getAsFunction()) {
                // make sure there isn't a variable of this name
                if (! separateNameSpaces && level.find(name) != level.end())
                    return false;

                // insert, and whatever happens is okay
                level.insert(tLevelPair(insertName, &symbol));

                return true;
            } else
                return level.insert(tLevelPair(insertName, &symbol)).second;
        }
    }